

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O0

QRenderRule * __thiscall
QStyleSheetStyle::renderRule(QStyleSheetStyle *this,QObject *obj,int element,quint64 state)

{
  long lVar1;
  QLatin1StringView latin1;
  bool bVar2;
  QRenderRule *this_00;
  qsizetype qVar3;
  ulong uVar4;
  QRenderRule *in_RDI;
  ulong in_R8;
  long in_FS_OFFSET;
  Selector *selector;
  int i;
  quint64 stateMask;
  QHash<unsigned_long_long,_QRenderRule> *cache;
  QRenderRule *newRule;
  QList<QCss::Declaration> decls;
  QString part;
  QObject *in_stack_000000d0;
  quint64 negated;
  QList<QCss::StyleRule> rules;
  const_iterator cacheIt;
  QObject *in_stack_00000478;
  QRenderRule *in_stack_fffffffffffffec8;
  QRenderRule *in_stack_fffffffffffffed0;
  QRenderRule *this_01;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  const_reference in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  int iVar5;
  QList<QCss::StyleRule> *styleRules;
  Data *local_58;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  qt_check_if_internal_object((QObject **)in_RDI,&in_stack_fffffffffffffed0->features);
  QHash<const_QObject_*,_QHash<int,_QHash<unsigned_long_long,_QRenderRule>_>_>::operator[]
            ((QHash<const_QObject_*,_QHash<int,_QHash<unsigned_long_long,_QRenderRule>_>_> *)this_01
             ,(QObject **)in_RDI);
  QHash<int,_QHash<unsigned_long_long,_QRenderRule>_>::operator[]
            ((QHash<int,_QHash<unsigned_long_long,_QRenderRule>_> *)this_01,&in_RDI->features);
  QHash<unsigned_long_long,_QRenderRule>::constFind
            ((QHash<unsigned_long_long,_QRenderRule> *)in_stack_fffffffffffffed0,
             (unsigned_long_long *)in_stack_fffffffffffffec8);
  QHash<unsigned_long_long,_QRenderRule>::constEnd((QHash<unsigned_long_long,_QRenderRule> *)in_RDI)
  ;
  bVar2 = QHash<unsigned_long_long,_QRenderRule>::const_iterator::operator!=
                    ((const_iterator *)in_RDI,(const_iterator *)in_stack_fffffffffffffed0);
  if (bVar2) {
    QHash<unsigned_long_long,_QRenderRule>::const_iterator::value((const_iterator *)0x4279b7);
    QRenderRule::QRenderRule(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  }
  else {
    bVar2 = initObject((QStyleSheetStyle *)
                       CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                       (QObject *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
    if (bVar2) {
      styleRules = (QList<QCss::StyleRule> *)0x0;
      local_58 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      QStyleSheetStyle::styleRules((QStyleSheetStyle *)&DAT_aaaaaaaaaaaaaaaa,in_stack_00000478);
      iVar5 = 0;
      while( true ) {
        this_00 = (QRenderRule *)(long)iVar5;
        qVar3 = QList<QCss::StyleRule>::size((QList<QCss::StyleRule> *)&local_58);
        if (qVar3 <= (long)this_00) break;
        QList<QCss::StyleRule>::at
                  ((QList<QCss::StyleRule> *)this_00,(qsizetype)in_stack_fffffffffffffec8);
        in_stack_ffffffffffffff00 =
             QList<QCss::Selector>::at
                       ((QList<QCss::Selector> *)this_00,(qsizetype)in_stack_fffffffffffffec8);
        uVar4 = QCss::Selector::pseudoClass((ulonglong *)in_stack_ffffffffffffff00);
        styleRules = (QList<QCss::StyleRule> *)(uVar4 | (ulong)styleRules);
        iVar5 = iVar5 + 1;
      }
      QHash<unsigned_long_long,_QRenderRule>::constFind
                ((QHash<unsigned_long_long,_QRenderRule> *)this_00,
                 (unsigned_long_long *)in_stack_fffffffffffffec8);
      QHash<unsigned_long_long,_QRenderRule>::constEnd
                ((QHash<unsigned_long_long,_QRenderRule> *)in_RDI);
      bVar2 = QHash<unsigned_long_long,_QRenderRule>::const_iterator::operator!=
                        ((const_iterator *)in_RDI,(const_iterator *)this_00);
      if (bVar2) {
        memset(in_RDI,0xaa,0x88);
        QHash<unsigned_long_long,_QRenderRule>::const_iterator::value((const_iterator *)0x427b98);
        QRenderRule::QRenderRule(this_00,in_stack_fffffffffffffec8);
        QHash<unsigned_long_long,_QRenderRule>::operator[]
                  ((QHash<unsigned_long_long,_QRenderRule> *)this_01,(unsigned_long_long *)in_RDI);
        QRenderRule::operator=(this_00,in_stack_fffffffffffffec8);
      }
      else {
        QLatin1String::QLatin1String((QLatin1String *)this_01,(char *)in_RDI);
        latin1.m_data._0_4_ = in_stack_ffffffffffffff08;
        latin1.m_size = (qsizetype)in_stack_ffffffffffffff00;
        latin1.m_data._4_4_ = iVar5;
        QString::QString((QString *)this_01,latin1);
        declarations(styleRules,(QString *)CONCAT44(iVar5,in_stack_ffffffffffffff08),
                     (quint64)in_stack_ffffffffffffff00);
        memset(in_RDI,0xaa,0x88);
        QRenderRule::QRenderRule
                  ((QRenderRule *)rules.d.d,(QList<QCss::Declaration> *)negated,in_stack_000000d0);
        QHash<unsigned_long_long,_QRenderRule>::operator[]
                  ((QHash<unsigned_long_long,_QRenderRule> *)this_01,(unsigned_long_long *)in_RDI);
        QRenderRule::operator=(this_00,in_stack_fffffffffffffec8);
        if ((in_R8 & (ulong)styleRules) != in_R8) {
          QHash<unsigned_long_long,_QRenderRule>::operator[]
                    ((QHash<unsigned_long_long,_QRenderRule> *)this_01,(unsigned_long_long *)in_RDI)
          ;
          QRenderRule::operator=(this_00,in_stack_fffffffffffffec8);
        }
        QList<QCss::Declaration>::~QList((QList<QCss::Declaration> *)0x427d5d);
        QString::~QString((QString *)0x427d6a);
      }
      QList<QCss::StyleRule>::~QList((QList<QCss::StyleRule> *)0x427d77);
    }
    else {
      QRenderRule::QRenderRule(in_stack_fffffffffffffed0);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return this_01;
}

Assistant:

QRenderRule QStyleSheetStyle::renderRule(const QObject *obj, int element, quint64 state) const
{
    qt_check_if_internal_object(&obj, &element);
    QHash<quint64, QRenderRule> &cache = styleSheetCaches->renderRulesCache[obj][element];
    QHash<quint64, QRenderRule>::const_iterator cacheIt = cache.constFind(state);
    if (cacheIt != cache.constEnd())
        return cacheIt.value();

    if (!initObject(obj))
        return QRenderRule();

    quint64 stateMask = 0;
    const QList<StyleRule> rules = styleRules(obj);
    for (int i = 0; i < rules.size(); i++) {
        const Selector& selector = rules.at(i).selectors.at(0);
        quint64 negated = 0;
        stateMask |= selector.pseudoClass(&negated);
        stateMask |= negated;
    }

    cacheIt = cache.constFind(state & stateMask);
    if (cacheIt != cache.constEnd()) {
        QRenderRule newRule = cacheIt.value();
        cache[state] = newRule;
        return newRule;
    }


    const QString part = QLatin1StringView(knownPseudoElements[element].name);
    QList<Declaration> decls = declarations(rules, part, state);
    QRenderRule newRule(decls, obj);
    cache[state] = newRule;
    if ((state & stateMask) != state)
        cache[state&stateMask] = newRule;
    return newRule;
}